

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marry.c
# Opt level: O0

uint16_t nuts_next_port(void)

{
  ushort uVar1;
  int iVar2;
  time_t tVar3;
  uint local_34;
  char *pcStack_30;
  uint seed;
  char *str;
  uint16_t end;
  uint16_t base;
  FILE *pFStack_20;
  uint16_t port;
  FILE *f;
  char *name;
  
  f = (FILE *)getenv("NUTS_PORT_FILE");
  if (f == (FILE *)0x0) {
    f = (FILE *)anon_var_dwarf_1dd49;
  }
  pcStack_30 = getenv("NUTS_PORT_RANGE");
  if (((pcStack_30 == (char *)0x0) ||
      (iVar2 = __isoc99_sscanf(pcStack_30,"%hu:%hu",(long)&str + 4,(long)&str + 2), iVar2 != 1)) ||
     ((int)((uint)str._2_2_ - (uint)str._4_2_) < 1)) {
    str._4_2_ = 38000;
    str._2_2_ = 40000;
  }
  pFStack_20 = fopen((char *)f,"r+");
  if ((pFStack_20 == (FILE *)0x0) && (pFStack_20 = fopen((char *)f,"w+"), pFStack_20 == (FILE *)0x0)
     ) {
    return 0;
  }
  fseek(pFStack_20,0,0);
  iVar2 = fileno(pFStack_20);
  iVar2 = lockf(iVar2,0,1);
  if (iVar2 == 0) {
    iVar2 = __isoc99_fscanf(pFStack_20,"%hu",(long)&str + 6);
    if (iVar2 != 1) {
      tVar3 = time((time_t *)0x0);
      uVar1 = str._4_2_;
      local_34 = (uint)tVar3;
      iVar2 = rand_r(&local_34);
      str._6_2_ = uVar1 + (short)(iVar2 % (int)((uint)str._2_2_ - (uint)str._4_2_));
    }
    str._6_2_ = str._6_2_ + 1;
    if ((str._6_2_ < str._4_2_) || ((uint)str._4_2_ + (uint)str._2_2_ <= (uint)str._6_2_)) {
      str._6_2_ = str._4_2_;
    }
    fseek(pFStack_20,0,0);
    iVar2 = fileno(pFStack_20);
    iVar2 = ftruncate(iVar2,0);
    if (iVar2 == 0) {
      fprintf(pFStack_20,"%u",(ulong)str._6_2_);
      iVar2 = fileno(pFStack_20);
      lockf(iVar2,0,0);
      fclose(pFStack_20);
      name._6_2_ = str._6_2_;
    }
    else {
      fclose(pFStack_20);
      name._6_2_ = 0;
    }
  }
  else {
    fclose(pFStack_20);
    name._6_2_ = 0;
  }
  return name._6_2_;
}

Assistant:

uint16_t
nuts_next_port(void)
{
	char    *name;
	FILE    *f;
	uint16_t port;
	uint16_t base;
	uint16_t end;
	char    *str;
#ifdef _WIN32
	OVERLAPPED olp;
	HANDLE     h;
#endif

	if ((name = getenv("NUTS_PORT_FILE")) == NULL) {
		name = ".nuts_ports";
	}
	if (((str = getenv("NUTS_PORT_RANGE")) == NULL) ||
	    ((sscanf(str, "%hu:%hu", &base, &end)) != 1) ||
	    ((int) end - (int) base) < 1) {
		base = 38000;
		end  = 40000;
	}

	if (((f = fopen(name, "r+")) == NULL) &&
	    ((f = fopen(name, "w+")) == NULL)) {
		return (0);
	}
	(void) fseek(f, 0, SEEK_SET);

#ifdef _WIN32
	h = (HANDLE) _get_osfhandle(_fileno(f));

	// This contains the offset information for LockFileEx.
	ZeroMemory(&olp, sizeof(olp));

	if (LockFileEx(h, LOCKFILE_EXCLUSIVE_LOCK, 0, MAXDWORD, MAXDWORD,
	        &olp) == FALSE) {
		fclose(f);
		return (0);
	}
#else
	if (lockf(fileno(f), 0, F_LOCK) != 0) {
		(void) fclose(f);
		return (0);
	}
#endif
	if (fscanf(f, "%hu", &port) != 1) {
		unsigned seed = (unsigned) time(NULL);

#ifdef _WIN32
		port = base + rand_s(&seed) % (end - base);
#else
		port = base + rand_r(&seed) % (end - base);
#endif
	}
	port++;
	if ((port < base) || (port >= (base + end))) {
		port = base;
	}

#ifdef _WIN32
	fseek(f, 0, SEEK_SET);
	SetEndOfFile(h);
	(void) fprintf(f, "%u", port);
	ZeroMemory(&olp, sizeof(olp));
	(void) UnlockFileEx(h, 0, MAXDWORD, MAXDWORD, &olp);
#else
	fseek(f, 0, SEEK_SET);
	if (ftruncate(fileno(f), 0) != 0) {
		(void) fclose(f);
		return (0);
	}

	(void) fprintf(f, "%u", port);
	(void) lockf(fileno(f), 0, F_ULOCK);

#endif
	(void) fclose(f);
	return (port);
}